

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase96::run(TestCase96 *this)

{
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  ThrowingDestructor t_1;
  char *local_688;
  ThrowingDestructor t;
  DebugComparison<const_char_(&)[31],_kj::StringPtr> _kjCondition;
  char *local_648;
  size_t sStack_640;
  undefined1 local_608 [264];
  Detail *local_500;
  RemoveConst<kj::Exception::Detail> *pRStack_4f8;
  Detail *local_4f0;
  ArrayDisposer *pAStack_4e8;
  Maybe<kj::Exception> e;
  StringPtr local_348 [50];
  
  UnwindDetector::UnwindDetector(&t.super_UnwindDetector);
  ThrowingDestructor::~ThrowingDestructor(&t);
  e.ptr.isSet = false;
  this_00 = &e.ptr.field_1;
  _kjCondition.right.content.ptr =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
  ;
  _kjCondition.right.content.size_ = CONCAT44(_kjCondition.right.content.size_._4_4_,0x69);
  _kjCondition.left._0_1_ = 1;
  Debug::log<char_const(&)[19],char_const(&)[19]>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x69,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
             (char (*) [19])"Expected exception");
  AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  UnwindDetector::UnwindDetector(&t_1.super_UnwindDetector);
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[4]>
            ((Fault *)local_348,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
             ,0x6f,FAILED,(char *)0x0,"\"baz\"",(char (*) [4])0x1ed8ad);
  Debug::Fault::~Fault((Fault *)local_348);
  ThrowingDestructor::~ThrowingDestructor(&t_1);
  _kjCondition.left._0_1_ = '\0';
  if (e.ptr.isSet == true) {
    e.ptr.isSet = false;
    Exception::~Exception(&this_00->value);
  }
  if ((char)_kjCondition.left == '\x01') {
    e.ptr.field_1.value.ownFile.content.ptr = _kjCondition.right.content.ptr;
    e.ptr.field_1.value.ownFile.content.size_ = _kjCondition.right.content.size_;
    e.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)_kjCondition.op.content.ptr;
    _kjCondition.right.content.ptr = (char *)0x0;
    _kjCondition.right.content.size_ = 0;
    e.ptr.field_1.value.file = (char *)_kjCondition.op.content.size_;
    e.ptr.field_1.value.description.content.ptr = local_648;
    e.ptr.field_1.value.description.content.size_ = sStack_640;
    memcpy((void *)((long)&e.ptr.field_1 + 0x68),local_608,0x105);
    e.ptr.field_1.value.details.builder.ptr = local_500;
    e.ptr.field_1.value.details.builder.pos = pRStack_4f8;
    e.ptr.field_1.value.details.builder.endPtr = local_4f0;
    e.ptr.field_1.value.details.builder.disposer = pAStack_4e8;
    local_500 = (Detail *)0x0;
    pRStack_4f8 = (RemoveConst<kj::Exception::Detail> *)0x0;
    local_4f0 = (Detail *)0x0;
    e.ptr.isSet = true;
    _kjCondition.left._0_1_ = '\0';
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  if ((char)_kjCondition.left == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  if (e.ptr.isSet == true) {
    local_688 = "baz";
    local_348[0].content.ptr = e.ptr.field_1.value.description.content.ptr;
    if (e.ptr.field_1.value.description.content.size_ == 0) {
      local_348[0].content.ptr = "";
    }
    local_348[0].content.size_ =
         e.ptr.field_1.value.description.content.size_ +
         (e.ptr.field_1.value.description.content.size_ == 0);
    DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_kj::StringPtr> *)&_kjCondition,
               (DebugExpression<char_const(&)[4]> *)&local_688,local_348);
    if ((_kjCondition.result == false) && (Debug::minSeverity < 3)) {
      if (e.ptr.field_1.value.description.content.size_ == 0) {
        e.ptr.field_1.value.description.content.ptr = "";
      }
      local_348[0].content.size_ =
           e.ptr.field_1.value.description.content.size_ +
           (e.ptr.field_1.value.description.content.size_ == 0);
      local_348[0].content.ptr = e.ptr.field_1.value.description.content.ptr;
      Debug::
      log<char_const(&)[50],kj::_::DebugComparison<char_const(&)[4],kj::StringPtr>&,char_const(&)[4],kj::StringPtr>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x75,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (ex.getDescription())\", _kjCondition, \"baz\", ex.getDescription()"
                 ,(char (*) [50])"failed: expected (\"baz\") == (ex.getDescription())",
                 (DebugComparison<const_char_(&)[4],_kj::StringPtr> *)&_kjCondition,
                 (char (*) [4])0x1ed8ad,local_348);
    }
  }
  else {
    _kjCondition.right.content.ptr =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
    ;
    _kjCondition.right.content.size_ = CONCAT44(_kjCondition.right.content.size_._4_4_,0x77);
    _kjCondition.left._0_1_ = '\x01';
    Debug::log<char_const(&)[19],char_const(&)[19]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x77,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [19])"Expected exception");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&_kjCondition);
  }
  if (e.ptr.isSet == true) {
    Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

~ThrowingDestructor() noexcept(false) {
    catchExceptionsIfUnwinding([]() {
      KJ_FAIL_ASSERT("this is a test, not a real bug");
    });
  }